

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::gc_pass_finish(CVmObjTable *this)

{
  int iVar1;
  int iVar2;
  CVmObject *pCVar3;
  size_t sVar4;
  CVmObjTable *in_RDI;
  vm_obj_id_t id;
  size_t j;
  size_t i;
  CVmObjPageEntry *entry;
  CVmObjPageEntry **pg;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint id_00;
  vm_obj_id_t id_01;
  long lVar5;
  CVmObjTable *this_00;
  CVmObjPageEntry *local_18;
  CVmObjPageEntry **local_10;
  
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  gc_trace_work_queue((CVmObjTable *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      iVar2);
  id_00 = 0;
  local_10 = in_RDI->pages_;
  for (sVar4 = in_RDI->pages_used_; sVar4 != 0; sVar4 = sVar4 - 1) {
    local_18 = *local_10;
    for (lVar5 = 0x1000; lVar5 != 0; lVar5 = lVar5 + -1) {
      if (((*(ushort *)&local_18->field_0x14 & 1) == 0) &&
         ((*(ushort *)&local_18->field_0x14 >> 1 & 1) == 0)) {
        if (((*(ushort *)&local_18->field_0x14 >> 2 & 3) != 2) &&
           ((*(ushort *)&local_18->field_0x14 >> 4 & 3) == 0)) {
          pCVar3 = CVmObjPageEntry::get_vm_obj(local_18);
          iVar1 = (*pCVar3->_vptr_CVmObject[4])(pCVar3,(ulong)id_00);
          if (iVar1 == 0) {
            *(ushort *)&local_18->field_0x14 = *(ushort *)&local_18->field_0x14 & 0xffcf | 0x20;
          }
          else {
            *(ushort *)&local_18->field_0x14 = *(ushort *)&local_18->field_0x14 & 0xffcf | 0x10;
          }
        }
        if ((*(ushort *)&local_18->field_0x14 >> 4 & 3) == 1) {
          add_to_gc_queue(in_RDI,id_00,local_18,1);
        }
      }
      local_18 = local_18 + 1;
      id_00 = id_00 + 1;
    }
    local_10 = local_10 + 1;
  }
  gc_trace_work_queue((CVmObjTable *)CONCAT44(id_00,in_stack_ffffffffffffffd0),iVar2);
  id_01 = 0;
  local_10 = in_RDI->pages_;
  for (this_00 = (CVmObjTable *)in_RDI->pages_used_; this_00 != (CVmObjTable *)0x0;
      this_00 = (CVmObjTable *)&this_00[-1].field_0x7f) {
    local_18 = *local_10;
    for (lVar5 = 0x1000; lVar5 != 0; lVar5 = lVar5 + -1) {
      if ((*(ushort *)&local_18->field_0x14 & 1) == 0) {
        iVar2 = CVmObjPageEntry::is_deletable(local_18);
        if (iVar2 == 0) {
          if ((*(ushort *)&local_18->field_0x14 >> 10 & 1) != 0) {
            pCVar3 = CVmObjPageEntry::get_vm_obj(local_18);
            (*pCVar3->_vptr_CVmObject[0x12])();
          }
          if ((*(ushort *)&local_18->field_0x14 >> 4 & 3) == 1) {
            add_to_finalize_queue(in_RDI,id_01,local_18);
          }
          gc_set_init_conditions
                    (this_00,(vm_obj_id_t)((ulong)lVar5 >> 0x20),
                     (CVmObjPageEntry *)CONCAT44(id_01,in_stack_ffffffffffffffd0));
        }
        else {
          delete_entry(this_00,(vm_obj_id_t)((ulong)lVar5 >> 0x20),
                       (CVmObjPageEntry *)CONCAT44(id_01,in_stack_ffffffffffffffd0));
        }
      }
      local_18 = local_18 + 1;
      id_01 = id_01 + 1;
    }
    local_10 = local_10 + 1;
  }
  CVmUndo::gc_remove_stale_weak_refs((CVmUndo *)0x0);
  run_finalizers(this_00);
  return;
}

Assistant:

void CVmObjTable::gc_pass_finish(VMG0_)
{
    CVmObjPageEntry **pg;
    CVmObjPageEntry *entry;
    size_t i;
    size_t j;
    vm_obj_id_t id;

    /* 
     *   Make sure we're done processing the work queue -- keep calling
     *   gc_pass_continue() until it indicates that it's finished.  If
     *   we're skipping finalizers, stop as soon as the state structure
     *   indicates that we've started running finalizers.  
     */
    gc_trace_work_queue(vmg_ TRUE);

    /*
     *   We've now marked everything that's reachable from the root set as
     *   VMOBJ_REACHABLE.  We can therefore determine the set of objects
     *   that are newly 'finalizable' - an object becomes finalizable when
     *   it was previously 'unfinalizable' and is not reachable, because we
     *   can finalize an object any time after it first becomes unreachable.
     *   So, scan all objects for eligibility for the 'finalizable'
     *   transition, and make the transition in those objects.  
     */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* go through each entry on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; --j, ++entry, ++id)
        {
            /* 
             *   if this entry is not free and is not in the root set, check
             *   to see if its finalization status is changing 
             */
            if (!entry->free_ && !entry->in_root_set_)
            {
                /*
                 *   If the entry is not reachable, and was previously
                 *   unfinalizable, it is now finalizable.
                 *   
                 *   Note that an object must actually be reachable to avoid
                 *   become finalizable at this point.  Not only do
                 *   unreachable objects become finalizable, but
                 *   'f-reachable' objects do, too, since these are only
                 *   reachable from other finalizable objects.  
                 */
                if (entry->reachable_ != VMOBJ_REACHABLE
                    && entry->finalize_state_ == VMOBJ_UNFINALIZABLE)
                {
                    /*
                     *   This object is newly finalizable.  If it has no
                     *   finalizer, the object can go directly to the
                     *   'finalized' state; otherwise, add it to the queue
                     *   of objects with pending finalizers.  
                     */
                    if (entry->get_vm_obj()->has_finalizer(vmg_ id))
                    {
                        /* 
                         *   This object is not reachable from the root set
                         *   and was previously unfinalizable.  Make the
                         *   object finalizable.  
                         */
                        entry->finalize_state_ = VMOBJ_FINALIZABLE;
                    }
                    else
                    {
                        /* 
                         *   the entry has no finalizer, so we can make this
                         *   object 'finalized' immediately 
                         */
                        entry->finalize_state_ = VMOBJ_FINALIZED;
                    }

                    /* count it as a collected object */
                    IF_GC_STATS(gc_stats.count_free());
                }

                /*
                 *   If this object is finalizable, add it to the work queue
                 *   in state "f-reachable."  We must mark everything this
                 *   object references, directly or indirectly, as
                 *   f-reachable, which we'll do with another pass through
                 *   the gc queue momentarily.  
                 */
                if (entry->finalize_state_ == VMOBJ_FINALIZABLE)
                {
                    /* 
                     *   this object and all of the objects it references
                     *   are "f-reachable" 
                     */
                    add_to_gc_queue(id, entry, VMOBJ_F_REACHABLE);
                }
            }
        }
    }

    /*
     *   During the scan above, we put all of the finalizable objects in the
     *   work queue in reachability state 'f-reachable'.  (Actually,
     *   finalizable objects that were fully reachable were not put in the
     *   work queue, because they are in a stronger reachability state that
     *   we've already fully scanned.)  Trace the work queue so that we mark
     *   everything reachable indirectly from an f-reachable object as also
     *   being at least f-reachable.  
     */
    gc_trace_work_queue(vmg_ TRUE);

    /*
     *   We have now marked everything that's fully reachable as being in
     *   state 'reachable', and everything that's reachable from a
     *   finalizable object as being in state 'f-reachable'.  Anything that
     *   is still in state 'unreachable' is garbage and can be collected.  
     */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* go through each entry on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; --j, ++entry, ++id)
        {
            /* if it's not already free, process it */
            if (!entry->free_)
            {
                /* if the object is deletable, delete it */
                if (entry->is_deletable())
                {
                    /*
                     *   This object is completely unreachable, and it has
                     *   already been finalized.  This means there is no
                     *   possibility that the object could ever become
                     *   reachable again, hence we can discard the object.
                     */
                    delete_entry(vmg_ id, entry);
                }
                else
                {
                    /*
                     *   The object is reachable, so keep it around.  Since
                     *   it's staying around, and since we know which
                     *   objects we're deleting and which are staying, we
                     *   can ask this object to remove all of its "stale
                     *   weak references" - that is, weak references to
                     *   objects that we're about to delete.  Don't bother
                     *   notifying the object if it's incapable of keeping
                     *   weak references.  
                     */
                    if (entry->can_have_weak_refs_)
                        entry->get_vm_obj()->remove_stale_weak_refs(vmg0_);

                    /*
                     *   If this object is finalizable, put it in the
                     *   finalizer queue, so that we can run its finalizer
                     *   when we're done scanning the table.  
                     */
                    if (entry->finalize_state_ == VMOBJ_FINALIZABLE)
                        add_to_finalize_queue(id, entry);

                    /* 
                     *   restore initial conditions for this object, so that
                     *   we're properly set up for the next GC pass 
                     */
                    gc_set_init_conditions(id, entry);
                }
            }
        }
    }
    
    /*
     *   Go through the undo records and clear any stale weak references
     *   contained in the undo list.  
     */
    G_undo->gc_remove_stale_weak_refs(vmg0_);

    /*
     *   All of the finalizable objects are now in the finalizer queue.  Run
     *   through the finalizer queue and run each such object's finalizer. 
     */
    run_finalizers(vmg0_);
}